

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_stmt_status(sqlite3_stmt *pStmt,int op,int resetFlag)

{
  sqlite3 *db_00;
  sqlite3 *db;
  Vdbe *pVStack_20;
  u32 v;
  Vdbe *pVdbe;
  int resetFlag_local;
  int op_local;
  sqlite3_stmt *pStmt_local;
  
  if (op == 99) {
    db_00 = *(sqlite3 **)pStmt;
    pVStack_20 = (Vdbe *)pStmt;
    pVdbe._0_4_ = resetFlag;
    pVdbe._4_4_ = op;
    _resetFlag_local = pStmt;
    sqlite3_mutex_enter(db_00->mutex);
    db._4_4_ = 0;
    db_00->pnBytesFreed = (int *)((long)&db + 4);
    sqlite3VdbeClearObject(db_00,pVStack_20);
    sqlite3DbFree(db_00,pVStack_20);
    db_00->pnBytesFreed = (int *)0x0;
    sqlite3_mutex_leave(db_00->mutex);
  }
  else {
    db._4_4_ = *(int *)(pStmt + (long)op * 4 + 0xd0);
    if (resetFlag != 0) {
      *(undefined4 *)(pStmt + (long)op * 4 + 0xd0) = 0;
    }
  }
  return db._4_4_;
}

Assistant:

SQLITE_API int sqlite3_stmt_status(sqlite3_stmt *pStmt, int op, int resetFlag){
  Vdbe *pVdbe = (Vdbe*)pStmt;
  u32 v;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !pStmt 
   || (op!=SQLITE_STMTSTATUS_MEMUSED && (op<0||op>=ArraySize(pVdbe->aCounter)))
  ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( op==SQLITE_STMTSTATUS_MEMUSED ){
    sqlite3 *db = pVdbe->db;
    sqlite3_mutex_enter(db->mutex);
    v = 0;
    db->pnBytesFreed = (int*)&v;
    sqlite3VdbeClearObject(db, pVdbe);
    sqlite3DbFree(db, pVdbe);
    db->pnBytesFreed = 0;
    sqlite3_mutex_leave(db->mutex);
  }else{
    v = pVdbe->aCounter[op];
    if( resetFlag ) pVdbe->aCounter[op] = 0;
  }
  return (int)v;
}